

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ktx::convertSINT<ImageT<unsigned_char,4u>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,ktx *this,
          unique_ptr<Image,_std::default_delete<Image>_> *image,string_view swizzle)

{
  if (image != (unique_ptr<Image,_std::default_delete<Image>_> *)0x0) {
    (**(code **)(**(long **)this + 0xa8))
              (*(long **)this,image,swizzle._M_len,swizzle._M_len,swizzle._M_str);
  }
  (**(code **)(**(long **)this + 0x70))(__return_storage_ptr__,*(long **)this,4,8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> convertSINT(const std::unique_ptr<Image>& image, std::string_view swizzle = "") {
    using ComponentT = typename T::Color::value_type;
    static constexpr auto componentCount = T::Color::getComponentCount();
    static constexpr auto bytesPerComponent = sizeof(ComponentT);
    static constexpr auto bits = bytesPerComponent * 8;

    if (!swizzle.empty())
        image->swizzle(swizzle);

    return image->getSINT(componentCount, bits);
}